

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.hpp
# Opt level: O3

bool __thiscall
qclab::qgates::PointerGate1<std::complex<float>_>::equals
          (PointerGate1<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  int iVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                         &PointerGate1<std::complex<float>>::typeinfo,0);
  if (lVar2 != 0) {
    other = *(QObject<std::complex<float>_> **)(lVar2 + 0x10);
  }
  iVar1 = (*other->_vptr_QObject[0xe])(other,this->gate_);
  return SUB41(iVar1,0);
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate1< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }